

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O3

string * __thiscall
Test::Formats::to_string_abi_cxx11_(string *__return_storage_ptr__,Formats *this,void *ptr)

{
  size_t sVar1;
  char buffer [32];
  char acStack_38 [40];
  
  snprintf(acStack_38,0x20,"%p",this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_38);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_38,acStack_38 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::to_string(const void *ptr) {
  char buffer[32];
#ifdef _MSC_VER
  sprintf_s(buffer, sizeof(buffer), "%p", ptr);
#else
  snprintf(buffer, sizeof(buffer), "%p", ptr);
#endif
  return buffer;
}